

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SuffixWriterFactory>
          (NLFeeder_Easy *this,SuffixWriterFactory *swf)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  reference pdVar4;
  size_type sVar5;
  const_reference pvVar6;
  NLFeeder_Easy *pNVar7;
  char *in_RSI;
  NLFeeder_Easy *in_RDI;
  size_t i_1;
  SuffixIntWriter sw_1;
  size_t i;
  SuffixDblWriter sw;
  bool ifVars;
  double v;
  const_iterator __end3;
  const_iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  int nnz;
  NLSuffix *suf;
  iterator __end2;
  iterator __begin2;
  NLSuffixSet *__range2;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  NLFeeder_Easy *in_stack_fffffffffffffef0;
  NLFeeder_Easy *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int local_f0;
  NLFeeder_Easy *local_d0;
  SparseVectorWriter<int,_int> local_c8;
  ulong local_b8;
  SparseVectorWriter<int,_double> local_a0;
  byte local_89;
  double local_88;
  double *local_80;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  vector<double,_std::allocator<double>_> *local_70;
  int local_64;
  reference local_60;
  _Self local_58;
  _Self local_50;
  undefined1 local_48 [48];
  undefined1 *local_18;
  char *local_10;
  
  local_10 = in_RSI;
  NLME(in_RDI);
  NLModel::Suffixes((NLModel *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_18 = local_48;
  local_50._M_node =
       (_Base_ptr)
       std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::begin
                 ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_58._M_node =
       (_Base_ptr)
       std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::end
                 ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar2 = std::operator!=(&local_50,&local_58), bVar2) {
    local_60 = std::_Rb_tree_const_iterator<mp::NLSuffix>::operator*
                         ((_Rb_tree_const_iterator<mp::NLSuffix> *)in_stack_fffffffffffffef0);
    local_64 = 0;
    local_70 = &local_60->values_;
    local_78._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_80 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_f0 = in_stack_ffffffffffffff0c;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
          bVar2) {
      pdVar4 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_78);
      local_88 = *pdVar4;
      if ((local_88 != 0.0) || (NAN(local_88))) {
        local_64 = local_64 + 1;
      }
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_78);
    }
    local_89 = (local_60->kind_ & 3U) == 0;
    if ((local_60->kind_ & 4U) == 0) {
      in_stack_ffffffffffffff00 = local_10;
      std::__cxx11::string::c_str();
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::SuffixWriterFactory::
      StartIntSuffix((SuffixWriterFactory *)CONCAT44(local_f0,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (int)in_stack_fffffffffffffef8);
      local_d0 = (NLFeeder_Easy *)0x0;
      while (in_stack_fffffffffffffef8 = local_d0,
            pNVar7 = (NLFeeder_Easy *)
                     std::vector<double,_std::allocator<double>_>::size(&local_60->values_),
            in_stack_fffffffffffffef8 < pNVar7) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_60->values_,(size_type)local_d0);
        if ((*pvVar6 != 0.0) || (NAN(*pvVar6))) {
          pNVar7 = local_d0;
          if ((local_89 & 1) != 0) {
            iVar3 = VPerm(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
            pNVar7 = (NLFeeder_Easy *)(long)iVar3;
          }
          in_stack_fffffffffffffef0 = pNVar7;
          in_stack_fffffffffffffeec = (int)in_stack_fffffffffffffef0;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_60->values_,(size_type)local_d0);
          round(*pvVar6);
          NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
          SparseVectorWriter<int,_int>::Write
                    ((SparseVectorWriter<int,_int> *)in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
        }
        local_d0 = (NLFeeder_Easy *)((long)&(local_d0->nlme_).prob_name_ + 1);
      }
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
      SparseVectorWriter<int,_int>::~SparseVectorWriter(&local_c8);
    }
    else {
      std::__cxx11::string::c_str();
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::SuffixWriterFactory::
      StartDblSuffix((SuffixWriterFactory *)CONCAT44(local_f0,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (int)in_stack_fffffffffffffef8);
      for (local_b8 = 0; uVar1 = local_b8,
          sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_60->values_),
          uVar1 < sVar5; local_b8 = local_b8 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_60->values_,local_b8);
        if ((*pvVar6 != 0.0) || (NAN(*pvVar6))) {
          if ((local_89 & 1) == 0) {
            local_f0 = (int)local_b8;
          }
          else {
            local_f0 = VPerm(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          }
          std::vector<double,_std::allocator<double>_>::operator[](&local_60->values_,local_b8);
          NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
          SparseVectorWriter<int,_double>::Write
                    ((SparseVectorWriter<int,_double> *)in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffeec,6.1881376295664e-318);
        }
      }
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
      SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_a0);
    }
    std::_Rb_tree_const_iterator<mp::NLSuffix>::operator++
              ((_Rb_tree_const_iterator<mp::NLSuffix> *)in_stack_fffffffffffffef0);
    in_stack_ffffffffffffff0c = local_f0;
  }
  NLSuffixSet::~NLSuffixSet((NLSuffixSet *)0x131a89);
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (const auto& suf: NLME().Suffixes()) {
      int nnz=0;
      for (auto v: suf.values_)
        if (v)
          ++nnz;
      bool ifVars = (0==(suf.kind_&3));
      if (suf.kind_ & 4) {
        auto sw = swf.StartDblSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     suf.values_[i]);
      } else {
        auto sw = swf.StartIntSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     std::round(suf.values_[i]));
      }
    }
  }